

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall
t_rb_generator::generate_rb_simple_exception_constructor
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  bool bVar1;
  uint uVar2;
  members_type *this_00;
  size_type sVar3;
  reference pptVar4;
  t_type *ptVar5;
  string *psVar6;
  t_rb_ofstream *ptVar7;
  ostream *poVar8;
  undefined1 local_50 [8];
  string name;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  t_struct *tstruct_local;
  t_rb_ofstream *out_local;
  t_rb_generator *this_local;
  
  this_00 = t_struct::get_members(tstruct);
  sVar3 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar3 == 1) {
    name.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&name.field_2 + 8));
    ptVar5 = t_field::get_type(*pptVar4);
    uVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[6])();
    if ((uVar2 & 1) != 0) {
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&name.field_2 + 8));
      psVar6 = t_field::get_name_abi_cxx11_(*pptVar4);
      std::__cxx11::string::string((string *)local_50,(string *)psVar6);
      ptVar7 = t_rb_ofstream::indent(out);
      poVar8 = std::operator<<((ostream *)ptVar7,"def initialize(message=nil)");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_rb_ofstream::indent_up(out);
      ptVar7 = t_rb_ofstream::indent(out);
      poVar8 = std::operator<<((ostream *)ptVar7,"super()");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      ptVar7 = t_rb_ofstream::indent(out);
      poVar8 = std::operator<<((ostream *)ptVar7,"self.");
      poVar8 = std::operator<<(poVar8,(string *)local_50);
      poVar8 = std::operator<<(poVar8," = message");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_rb_ofstream::indent_down(out);
      ptVar7 = t_rb_ofstream::indent(out);
      poVar8 = std::operator<<((ostream *)ptVar7,"end");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"message");
      if (bVar1) {
        ptVar7 = t_rb_ofstream::indent(out);
        poVar8 = std::operator<<((ostream *)ptVar7,"def message; ");
        poVar8 = std::operator<<(poVar8,(string *)local_50);
        poVar8 = std::operator<<(poVar8," end");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void t_rb_generator::generate_rb_simple_exception_constructor(t_rb_ofstream& out,
                                                              t_struct* tstruct) {
  const vector<t_field*>& members = tstruct->get_members();

  if (members.size() == 1) {
    vector<t_field*>::const_iterator m_iter = members.begin();

    if ((*m_iter)->get_type()->is_string()) {
      string name = (*m_iter)->get_name();

      out.indent() << "def initialize(message=nil)" << endl;
      out.indent_up();
      out.indent() << "super()" << endl;
      out.indent() << "self." << name << " = message" << endl;
      out.indent_down();
      out.indent() << "end" << endl << endl;

      if (name != "message") {
        out.indent() << "def message; " << name << " end" << endl << endl;
      }
    }
  }
}